

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O1

void __thiscall
tchecker::clock_updates_visitor_t::update_sum_to_clock_outside_loop
          (clock_updates_visitor_t *this,typed_lvalue_expression_t *x,typed_lvalue_expression_t *y,
          shared_ptr<const_tchecker::expression_t> *c)

{
  range_t<unsigned_int,_unsigned_int> rVar1;
  clock_updates_list_t *pcVar2;
  uint uVar3;
  clock_id_t z;
  clock_id_t x_00;
  clock_updates_list_t A;
  clock_updates_list_t local_50;
  clock_updates_list_t local_38;
  
  clock_updates_of_all_clock_instances(&local_38,this,y);
  operator+(&local_50,&local_38,c);
  std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>::~vector
            (&local_38._list);
  rVar1 = extract_lvalue_variable_ids(x);
  uVar3 = rVar1._end;
  x_00 = rVar1._begin;
  if (uVar3 - x_00 == 1) {
    pcVar2 = clock_updates_map_t::operator[](&this->_u,x_00);
    std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>::operator=
              (&pcVar2->_list,&local_50._list);
  }
  else if (uVar3 != x_00) {
    do {
      pcVar2 = clock_updates_map_t::operator[](&this->_u,rVar1._begin);
      clock_updates_list_t::absorbing_merge(pcVar2,&local_50);
      rVar1._begin = rVar1._begin + 1;
      rVar1._end = 0;
    } while (uVar3 != rVar1._begin);
  }
  std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>::~vector
            (&local_50._list);
  return;
}

Assistant:

void update_sum_to_clock_outside_loop(tchecker::typed_lvalue_expression_t const & x,
                                        tchecker::typed_lvalue_expression_t const & y,
                                        std::shared_ptr<tchecker::expression_t const> const & c)
  {
    tchecker::clock_updates_list_t A = clock_updates_of_all_clock_instances(y) + c;
    tchecker::range_t<tchecker::variable_id_t> x_instances = tchecker::extract_lvalue_variable_ids(x);
    if (single_instance(x_instances)) {
      tchecker::clock_id_t z = x_instances.begin();
      _u[z] = A;
    }
    else {
      for (tchecker::clock_id_t z = x_instances.begin(); z != x_instances.end(); ++z)
        _u[z].absorbing_merge(A);
    }
  }